

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O0

int GetScanDataResponseFromThreadRPLIDARx
              (RPLIDAR *pRPLIDAR,double *pDistance,double *pAngle,BOOL *pbNewScan,int *pQuality)

{
  int iVar1;
  int local_3c;
  int res;
  int id;
  int *pQuality_local;
  BOOL *pbNewScan_local;
  double *pAngle_local;
  double *pDistance_local;
  RPLIDAR *pRPLIDAR_local;
  
  local_3c = 0;
  do {
    if ((RPLIDAR *)addrsRPLIDAR[local_3c] == pRPLIDAR) {
      EnterCriticalSection(RPLIDARCS + local_3c);
      *pDistance = distanceRPLIDAR[local_3c];
      *pAngle = angleRPLIDAR[local_3c];
      *pbNewScan = bNewScanRPLIDAR[local_3c];
      *pQuality = qualityRPLIDAR[local_3c];
      iVar1 = resRPLIDAR[local_3c];
      LeaveCriticalSection(RPLIDARCS + local_3c);
      return iVar1;
    }
    local_3c = local_3c + 1;
  } while (local_3c < 0x10);
  return 1;
}

Assistant:

HARDWAREX_API int GetScanDataResponseFromThreadRPLIDARx(RPLIDAR* pRPLIDAR, double* pDistance, double* pAngle, BOOL* pbNewScan, int *pQuality)
{
	int id = 0, res = EXIT_FAILURE;

	while (addrsRPLIDAR[id] != pRPLIDAR)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return EXIT_FAILURE;
	}

	EnterCriticalSection(&RPLIDARCS[id]);
	*pDistance = distanceRPLIDAR[id];
	*pAngle = angleRPLIDAR[id];
	*pbNewScan = bNewScanRPLIDAR[id];
	*pQuality = qualityRPLIDAR[id];
	res = resRPLIDAR[id];
	LeaveCriticalSection(&RPLIDARCS[id]);

	return res;
}